

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void opengv::absolute_pose::modules::upnp_main_sym
               (Matrix<double,_10,_10,_0,_10,_10> *M,Matrix<double,_1,_10,_1,_1,_10> *C,double gamma
               ,vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                *quaternions)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int q;
  long lVar11;
  const_iterator __position;
  int i;
  long lVar12;
  ActualDstType actualDst;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  Vector4d quaternion;
  Transpose<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> destT;
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  bad_quaternions;
  Matrix<std::complex<double>,_8,_8,_0,_8,_8> V;
  Matrix<double,_8,_8,_0,_8,_8> Action;
  EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> Eig;
  undefined1 local_1400 [16];
  double dStack_13f0;
  double dStack_13e8;
  double local_13e0;
  Matrix<double,_10,_10,_0,_10,_10> *local_13d8;
  Scalar local_13d0;
  Transpose<const_Eigen::Transpose<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>_> local_13c8;
  Transpose<const_Eigen::Matrix<double,_10,_10,_0,_10,_10>_> local_13c0;
  Transpose<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> local_13b8;
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_13b0;
  undefined1 local_1390 [16];
  double dStack_1380;
  double dStack_1378;
  double dStack_1370;
  double dStack_1368;
  double dStack_1360;
  double dStack_1358;
  double local_1350;
  double dStack_1348;
  undefined1 local_1340 [32];
  Matrix<double,_1,_10,_1,_1,_10> local_1320;
  non_const_type local_12d0;
  EigenvectorsType local_12c0;
  EigenBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> local_ec0 [512];
  EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> local_cc0;
  
  local_13e0 = gamma;
  local_13d8 = M;
  upnp::setupAction_sym_gj(M,C,gamma,(Matrix<double,_8,_8,_0,_8,_8> *)local_ec0);
  local_cc0.m_realSchur.m_hess.m_isInitialized = false;
  lVar12 = 0;
  local_cc0.m_realSchur.m_isInitialized = false;
  local_cc0.m_realSchur.m_matUisUptodate = false;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[0]._M_value._0_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[0]._M_value._8_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[1]._M_value._0_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[1]._M_value._8_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[2]._M_value._0_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[2]._M_value._8_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[3]._M_value._0_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[3]._M_value._8_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[4]._M_value._0_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[4]._M_value._8_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[5]._M_value._0_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[5]._M_value._8_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[6]._M_value._0_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[6]._M_value._8_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[7]._M_value._0_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[7]._M_value._8_8_ = 0;
  local_cc0.m_isInitialized = false;
  local_cc0.m_eigenvectorsOk = false;
  local_cc0.m_realSchur.m_maxIters = -1;
  Eigen::EigenSolver<Eigen::Matrix<double,8,8,0,8,8>>::compute<Eigen::Matrix<double,8,8,0,8,8>>
            ((EigenSolver<Eigen::Matrix<double,8,8,0,8,8>> *)&local_cc0,local_ec0,true);
  Eigen::EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>::eigenvectors(&local_12c0,&local_cc0);
  local_13b0.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_13b0.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13b0.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    auVar17 = _local_1400;
    uVar1 = *(undefined8 *)
             (local_12c0.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>_>.
              m_storage.m_data.array + lVar12 * 8U + 7);
    dStack_13e8 = (double)uVar1;
    local_1400 = auVar17._0_16_;
    dStack_13f0 = (double)*(undefined8 *)
                           (local_12c0.
                            super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>_>
                            .m_storage.m_data.array + lVar12 * 8U + 6);
    local_1400._0_8_ = auVar17._0_8_;
    local_1400._8_8_ =
         *(undefined8 *)
          (local_12c0.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>_>.
           m_storage.m_data.array + lVar12 * 8U + 5);
    local_1400._0_8_ =
         *(undefined8 *)
          (local_12c0.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>_>.
           m_storage.m_data.array + lVar12 * 8U + 4);
    lVar11 = 0;
    dVar15 = 0.0;
    do {
      dVar15 = dVar15 + *(double *)(local_1400 + lVar11 * 8) * *(double *)(local_1400 + lVar11 * 8);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    if (dVar15 < 0.0) {
      dVar15 = sqrt(dVar15);
    }
    else {
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar15;
      auVar16 = vsqrtsd_avx(auVar16,auVar16);
      dVar15 = auVar16._0_8_;
    }
    auVar17._8_8_ = dVar15;
    auVar17._0_8_ = dVar15;
    auVar17._16_8_ = dVar15;
    auVar17._24_8_ = dVar15;
    _local_1400 = vdivpd_avx(_local_1400,auVar17);
    auVar17 = vpermpd_avx2(_local_1400,0xe9);
    auVar13 = vpermpd_avx512f(_DAT_001fd4c0,ZEXT3264(_local_1400));
    auVar14 = vpermpd_avx512f(_DAT_001fd500,ZEXT3264(_local_1400));
    _local_1390 = vmulpd_avx512f(auVar13,auVar14);
    auVar16 = vshufpd_avx(local_1400._16_16_,local_1400._16_16_,3);
    local_1350 = auVar17._0_8_ * auVar16._0_8_;
    dStack_1348 = auVar17._8_8_ * auVar16._8_8_;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [8] = 0.0;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [9] = 0.0;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [0] = 0.0;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [1] = 0.0;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [2] = 0.0;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [3] = 0.0;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [4] = 0.0;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [5] = 0.0;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [6] = 0.0;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [7] = 0.0;
    local_13d0 = 1.0;
    local_13c0.m_matrix = local_13d8;
    local_13c8.m_matrix.m_matrix = (non_const_type)(non_const_type)local_1390;
    local_13b8.m_matrix = &local_1320;
    local_1340._16_8_ = &local_1320;
    Eigen::internal::gemv_dense_selector<2,1,true>::
    run<Eigen::Transpose<Eigen::Matrix<double,10,10,0,10,10>const>,Eigen::Transpose<Eigen::Transpose<Eigen::Matrix<double,10,1,0,10,1>>const>,Eigen::Transpose<Eigen::Matrix<double,1,10,1,1,10>>>
              (&local_13c0,&local_13c8,&local_13b8,&local_13d0);
    dVar15 = (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.
             array[0];
    dVar2 = (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.
            array[1];
    dVar3 = (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.
            array[2];
    dVar4 = (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.
            array[3];
    dVar5 = (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.
            array[4];
    dVar6 = (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.
            array[5];
    dVar7 = (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.
            array[6];
    dVar8 = (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.
            array[7];
    dVar9 = (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.
            array[8];
    dVar10 = (C->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.
             array[9];
    local_1340._0_8_ =
         (double)local_1390._0_8_ *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_1340._16_8_)->m_storage
         ).m_data.array[0] +
         dStack_1380 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_1340._16_8_)->m_storage
         ).m_data.array[2] +
         dStack_1370 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_1340._16_8_)->m_storage
         ).m_data.array[4] +
         local_1350 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_1340._16_8_)->m_storage
         ).m_data.array[8] +
         dStack_1360 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_1340._16_8_)->m_storage
         ).m_data.array[6] +
         (double)local_1390._8_8_ *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_1340._16_8_)->m_storage
         ).m_data.array[1] +
         dStack_1378 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_1340._16_8_)->m_storage
         ).m_data.array[3] +
         dStack_1368 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_1340._16_8_)->m_storage
         ).m_data.array[5] +
         dStack_1348 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_1340._16_8_)->m_storage
         ).m_data.array[9] +
         dStack_1358 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_1340._16_8_)->m_storage
         ).m_data.array[7] +
         (double)local_1390._0_8_ * (dVar15 + dVar15) + dStack_1380 * (dVar3 + dVar3) +
         dStack_1370 * (dVar5 + dVar5) +
         dStack_1360 * (dVar7 + dVar7) + local_1350 * (dVar9 + dVar9) +
         (double)local_1390._8_8_ * (dVar2 + dVar2) + dStack_1378 * (dVar4 + dVar4) +
         dStack_1368 * (dVar6 + dVar6) +
         dStack_1358 * (dVar8 + dVar8) + dStack_1348 * (dVar10 + dVar10) + local_13e0;
    for (__position._M_current =
              (quaternions->
              super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
        (__position._M_current !=
         (quaternions->
         super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish &&
        ((__position._M_current)->first < (double)local_1340._0_8_));
        __position._M_current = __position._M_current + 1) {
    }
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [0] = (double)local_1400._0_8_;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [1] = (double)local_1400._8_8_;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [2] = dStack_13f0;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [3] = dStack_13e8;
    local_12d0 = (non_const_type)local_1390;
    std::
    vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
    ::_M_insert_rval(quaternions,__position,(value_type *)local_1340);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 8);
  if ((quaternions->
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (quaternions->
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    std::
    vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
    ::operator=(quaternions,&local_13b0);
  }
  if (local_13b0.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_13b0.
                 super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].second.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                 [3]);
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::upnp_main_sym(
    const Eigen::Matrix<double,10,10> & M,
    const Eigen::Matrix<double,1,10> & C,
    double gamma,
    std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > > & quaternions )
{
  Eigen::Matrix<double,8,8> Action;
  upnp::setupAction_sym_gj( M, C, gamma, Action );
  Eigen::EigenSolver< Eigen::Matrix<double,8,8> > Eig( Action, true );
  Eigen::Matrix<std::complex<double>,8,8> V = Eig.eigenvectors();
  
  //ok, let's cut the imaginary solutions (with a reasonable threshold!)
  // const double imagThreshold = 0.01;
  std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > > bad_quaternions;
  
  for( int i = 0; i < 8; i++ )
  {
    Eigen::Vector4d quaternion;
    quaternion[3] = V(7,i).real();
    quaternion[2] = V(6,i).real();
    quaternion[1] = V(5,i).real();
    quaternion[0] = V(4,i).real();
    
    double norm = 0.0;
    for( int q = 0; q < 4; q++ )
      norm += pow(quaternion[q],2.0);
    norm = sqrt(norm);
    for( int q = 0; q < 4; q++ )
      quaternion[q] /= norm;
    
    Eigen::Matrix<double,10,1> s;
    upnp_fill_s(quaternion,s);
    Eigen::Matrix<double,1,1> valueM = s.transpose() * M * s + 2.0 * C * s;
    double value = valueM[0] + gamma;

    if( true )//fabs(D[i].imag()) < imagThreshold ) //use all results for the moment
    {
      std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > >::iterator
          qidx = quaternions.begin();
      while( qidx != quaternions.end() && qidx->first < value )
        qidx++;
      
      quaternions.insert(qidx,std::pair<double,Eigen::Vector4d>(value,quaternion));
    }
    else
    {
      std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > >::iterator
          qidx = bad_quaternions.begin();
      while( qidx != bad_quaternions.end() && qidx->first < value )
        qidx++;
      
      bad_quaternions.insert(qidx,std::pair<double,Eigen::Vector4d>(value,quaternion));
    }
  }
  if( quaternions.size() == 0 )
    quaternions = bad_quaternions;
}